

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void bothcases(parse *p,int ch)

{
  char *pcVar1;
  char cVar2;
  char local_2b [3];
  char *pcStack_28;
  char bracket [3];
  char *oldend;
  char *oldnext;
  int ch_local;
  parse *p_local;
  
  pcVar1 = p->next;
  pcStack_28 = p->end;
  cVar2 = othercase(ch);
  if (cVar2 == ch) {
    __assert_fail("othercase(ch) != ch",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                  ,0x3dd,"void bothcases()");
  }
  p->next = local_2b;
  p->end = local_2b + 2;
  local_2b[0] = (char)ch;
  local_2b[1] = 0x5d;
  local_2b[2] = 0;
  p_bracket(p);
  if (p->next == local_2b + 2) {
    p->next = pcVar1;
    p->end = pcStack_28;
    return;
  }
  __assert_fail("p->next == bracket+2",
                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                ,0x3e4,"void bothcases()");
}

Assistant:

static void
bothcases(p, ch)
struct parse *p;
int ch;
{
	char *oldnext = p->next;
	char *oldend = p->end;
	char bracket[3];

	assert(othercase(ch) != ch);	/* p_bracket() would recurse */
	p->next = bracket;
	p->end = bracket+2;
	bracket[0] = (char)ch;
	bracket[1] = ']';
	bracket[2] = '\0';
	p_bracket(p);
	assert(p->next == bracket+2);
	p->next = oldnext;
	p->end = oldend;
}